

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug-test.c++
# Opt level: O0

void __thiscall
kj::_::anon_unknown_0::MockExceptionCallback::onRecoverableException
          (MockExceptionCallback *this,Exception *exception)

{
  char *pcVar1;
  char *__first;
  Exception *params;
  char *end;
  String what;
  Exception *exception_local;
  MockExceptionCallback *this_local;
  
  what.content.disposer = (ArrayDisposer *)exception;
  ::std::__cxx11::string::operator+=((string *)&this->text,"recoverable exception: ");
  str<kj::Exception&>((String *)&end,(kj *)what.content.disposer,params);
  pcVar1 = String::cStr((String *)&end);
  pcVar1 = strstr(pcVar1,"\nstack: ");
  if (pcVar1 == (char *)0x0) {
    pcVar1 = String::cStr((String *)&end);
    ::std::__cxx11::string::operator+=((string *)&this->text,pcVar1);
  }
  else {
    __first = String::cStr((String *)&end);
    ::std::__cxx11::string::append<char_const*,void>((string *)&this->text,__first,pcVar1);
  }
  ::std::__cxx11::string::operator+=((string *)&this->text,'\n');
  flush(this);
  String::~String((String *)&end);
  return;
}

Assistant:

void onRecoverableException(Exception&& exception) override {
    text += "recoverable exception: ";
    auto what = str(exception);
    // Discard the stack trace.
    const char* end = strstr(what.cStr(), "\nstack: ");
    if (end == nullptr) {
      text += what.cStr();
    } else {
      text.append(what.cStr(), end);
    }
    text += '\n';
    flush();
  }